

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O0

UBool __thiscall
icu_63::TimeArrayTimeZoneRule::getNextStart
          (TimeArrayTimeZoneRule *this,UDate base,int32_t prevRawOffset,int32_t prevDSTSavings,
          UBool inclusive,UDate *result)

{
  UDate UVar1;
  UDate time;
  int32_t i;
  UDate *result_local;
  UBool inclusive_local;
  int32_t prevDSTSavings_local;
  int32_t prevRawOffset_local;
  UDate base_local;
  TimeArrayTimeZoneRule *this_local;
  
  time._4_4_ = this->fNumStartTimes;
  while ((time._4_4_ = time._4_4_ + -1, -1 < time._4_4_ &&
         (UVar1 = getUTC(this,this->fStartTimes[time._4_4_],prevRawOffset,prevDSTSavings),
         base <= UVar1))) {
    if (inclusive == '\0') {
      if ((UVar1 == base) && (!NAN(UVar1) && !NAN(base))) break;
    }
    *result = UVar1;
  }
  return time._4_4_ != this->fNumStartTimes + -1;
}

Assistant:

UBool
TimeArrayTimeZoneRule::getNextStart(UDate base,
                                    int32_t prevRawOffset,
                                    int32_t prevDSTSavings,
                                    UBool inclusive,
                                    UDate& result) const {
    int32_t i = fNumStartTimes - 1;
    for (; i >= 0; i--) {
        UDate time = getUTC(fStartTimes[i], prevRawOffset, prevDSTSavings);
        if (time < base || (!inclusive && time == base)) {
            break;
        }
        result = time;
    }
    if (i == fNumStartTimes - 1) {
        return FALSE;
    }
    return TRUE;
}